

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpeechBubble.h
# Opt level: O3

void __thiscall SpeechBubble::SpeechBubble(SpeechBubble *this)

{
  (this->curText)._M_dataplus._M_p = (pointer)&(this->curText).field_2;
  (this->curText)._M_string_length = 0;
  (this->curText).field_2._M_local_buf[0] = '\0';
  (this->sprite).super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->sprite).super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  SoLoud::Wav::Wav(&this->soundSample);
  this->timeElapsed = 0.0;
  (this->position).x = 0;
  *(undefined8 *)&(this->position).y = 0;
  (this->scale).y = 0;
  return;
}

Assistant:

SpeechBubble() = default;